

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O0

SquareMatrix<std::complex<double>_> * __thiscall
qclab::dense::SquareMatrix<std::complex<double>_>::operator=
          (SquareMatrix<std::complex<double>_> *this,SquareMatrix<std::complex<double>_> *matrix)

{
  int64_t iVar1;
  complex<double> *pcVar2;
  type pcVar3;
  size_t local_30;
  int64_t i;
  complex<double> *data;
  SquareMatrix<std::complex<double>_> *local_18;
  SquareMatrix<std::complex<double>_> *matrix_local;
  SquareMatrix<std::complex<double>_> *this_local;
  
  local_18 = matrix;
  matrix_local = this;
  iVar1 = size(matrix);
  if (iVar1 != this->size_) {
    iVar1 = size(local_18);
    this->size_ = iVar1;
    alloc_unique_array<std::complex<double>>((dense *)&data,this->size_ * this->size_);
    std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::operator=
              (&this->data_,
               (unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
               &data);
    std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
    ~unique_ptr((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
                &data);
  }
  pcVar2 = ptr(local_18);
  for (local_30 = 0; (long)local_30 < this->size_ * this->size_; local_30 = local_30 + 1) {
    pcVar3 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
             operator[](&this->data_,local_30);
    *(undefined8 *)pcVar3->_M_value = *(undefined8 *)pcVar2[local_30]._M_value;
    *(undefined8 *)(pcVar3->_M_value + 8) = *(undefined8 *)(pcVar2[local_30]._M_value + 8);
  }
  return this;
}

Assistant:

SquareMatrix< T >& operator=( const SquareMatrix< T >& matrix ) {
          if ( matrix.size() != size_ ) {
            size_ = matrix.size() ;
            data_ = std::move( alloc_unique_array< T >( size_ * size_ ) ) ;
          }
          const T* data = matrix.ptr() ;
          #pragma omp parallel for
          for ( int64_t i = 0; i < size_*size_; i++ ) {
            data_[i] = data[i] ;
          }
          return *this ;
        }